

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_read_attributes_uint8(void *a,uint8_t **attrib)

{
  trico_stream_type tVar1;
  int iVar2;
  ssize_t sVar3;
  char *source;
  uint32_t bytes_decompressed;
  void *compressed;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_attribs;
  trico_archive *arch;
  uint8_t **attrib_local;
  void *a_local;
  
  _nr_of_compressed_bytes = (trico_archive *)a;
  arch = (trico_archive *)attrib;
  attrib_local = (uint8_t **)a;
  tVar1 = trico_get_next_stream_type(a);
  if (tVar1 == trico_attribute_uint8_stream) {
    sVar3 = read((int)&compressed + 4,(void *)0x4,1);
    if ((int)sVar3 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      sVar3 = read((int)&compressed,(void *)0x4,1);
      if ((int)sVar3 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        source = (char *)trico_malloc((ulong)(uint)compressed);
        sVar3 = read((int)source,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar3 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          if ((arch != (trico_archive *)0x0) &&
             (iVar2 = LZ4_decompress_safe(source,(char *)arch,(uint)compressed,compressed._4_4_),
             iVar2 != compressed._4_4_)) {
            __assert_fail("bytes_decompressed == nr_of_attribs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x5a0,"int trico_read_attributes_uint8(void *, uint8_t **)");
          }
          trico_free(source);
          read_next_stream_type(_nr_of_compressed_bytes);
          a_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int trico_read_attributes_uint8(void* a, uint8_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_uint8_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;

  if (attrib != NULL)
    {
    uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)attrib, nr_of_compressed_bytes, nr_of_attribs);
    assert(bytes_decompressed == nr_of_attribs);
    (void)bytes_decompressed; //suppress warning
    }

  trico_free(compressed);  

  read_next_stream_type(arch);

  return 1;
  }